

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O0

void deq(Block *b,ProxyWithLink *cp)

{
  int iVar1;
  BlockID *pBVar2;
  size_t sVar3;
  char *in_RDX;
  char *__to;
  ProxyWithLink *in_RSI;
  char *__from;
  Proxy *in_RDI;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int gid;
  int i;
  Link *l;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  ProxyWithLink *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  Proxy *in_stack_ffffffffffffffd0;
  int local_1c;
  
  diy::Master::ProxyWithLink::link(in_RSI,(char *)in_RSI,in_RDX);
  local_1c = 0;
  while( true ) {
    iVar1 = diy::Link::size((Link *)0x10d877);
    if (iVar1 <= local_1c) break;
    pBVar2 = diy::Link::target((Link *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    __from = (char *)(ulong)(uint)pBVar2->gid;
    diy::Master::Proxy::incoming(&in_stack_ffffffffffffffc0->super_Proxy,in_stack_ffffffffffffffbc);
    sVar3 = diy::MemoryBuffer::size((MemoryBuffer *)0x10d8af);
    iVar1 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    if (sVar3 != 0) {
      in_stack_ffffffffffffffc0 = in_RSI;
      diy::Master::ProxyWithLink::link(in_RSI,__from,__to);
      diy::Link::target((Link *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      diy::Master::Proxy::dequeue<int>
                (in_stack_ffffffffffffffd0,iVar1,(int *)in_stack_ffffffffffffffc0,
                 (_func_void_BinaryBuffer_ptr_int_ptr *)
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      in_stack_ffffffffffffffc8 = _stderr;
      diy::Master::Proxy::gid(&in_RSI->super_Proxy);
      in_stack_ffffffffffffffd0 = in_RDI;
      diy::Link::target((Link *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      fmt::v7::print<char[52],int,int&,int&,char>
                ((FILE *)cp,(char (*) [52])l,_gid,in_stack_00000020,in_stack_00000018);
      in_RDI->gid_ = in_RDI->gid_ + 1;
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void deq(Block* b, const diy::Master::ProxyWithLink& cp)
{
    diy::Link* l = cp.link();

    for (int i = 0; i < l->size(); ++i)
    {
        int gid = l->target(i).gid;
        if (cp.incoming(gid).size())
        {
            cp.dequeue(cp.link()->target(i).gid, b->count);
            fmt::print(stderr, "Dequeue: gid {} received value {} from link gid {}\n",
                    cp.gid(), b->count, l->target(i).gid);
            b->count++;
        }
    }
}